

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O3

void adjabil(int oldlevel,int newlevel)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  innate *piVar4;
  bool bVar5;
  uint *puVar6;
  uint uVar7;
  char *line;
  innate *piVar8;
  innate *piVar9;
  bool bVar10;
  
  uVar2 = urole._208_4_ - 0x159;
  if (((ushort)uVar2 < 0x10) && ((0xfdf7U >> (uVar2 & 0x1f) & 1) != 0)) {
    piVar4 = (innate *)(&DAT_0029e4c8 + *(int *)(&DAT_0029e4c8 + (ulong)(uVar2 & 0xffff) * 4));
    bVar10 = urace.malenum == 0x111 || urace.malenum == 0x4a;
    bVar5 = true;
  }
  else {
    bVar10 = urace.malenum == 0x111 || urace.malenum == 0x4a;
    piVar4 = (innate *)0x0;
    bVar5 = false;
    if ((urace.malenum != 0x111) && (urace.malenum != 0x4a)) {
LAB_0014ffe1:
      if (oldlevel < 1) {
        return;
      }
      if (newlevel - oldlevel == 0 || newlevel < oldlevel) {
        lose_weapon_skill(oldlevel - newlevel);
        return;
      }
      add_weapon_skill(newlevel - oldlevel);
      return;
    }
  }
  piVar8 = orc_abil;
  if (urace.malenum != 0x4a) {
    piVar8 = (innate *)0x0;
  }
  piVar9 = elf_abil;
  if (urace.malenum != 0x111) {
    piVar9 = piVar8;
  }
  uVar2 = 0x1000000;
  do {
    if ((!bVar5) || (puVar6 = piVar4->ability, puVar6 == (uint *)0x0)) {
      if ((!bVar10) || (puVar6 = piVar9->ability, puVar6 == (uint *)0x0)) goto LAB_0014ffe1;
      uVar2 = 0x2000000;
      piVar4 = piVar9;
      piVar9 = (innate *)0x0;
    }
    uVar1 = *puVar6;
    iVar3 = (int)piVar4->ulevel;
    if (newlevel < iVar3 || iVar3 <= oldlevel) {
      if ((iVar3 <= oldlevel && newlevel < iVar3) &&
         (*puVar6 = ~uVar2 & uVar1, (~uVar2 & uVar1 & 0x7000000) == 0)) {
        if (*piVar4->losestr != '\0') goto LAB_0014ff8c;
        if (*piVar4->gainstr != '\0') {
          line = "You feel less %s!";
          goto LAB_0014ff93;
        }
      }
    }
    else {
      uVar7 = uVar1 | uVar2 | 0x4000000;
      if (piVar4->ulevel != '\x01') {
        uVar7 = uVar1 | uVar2;
      }
      *puVar6 = uVar7;
      if (((~uVar2 & uVar7 & 0x7000000) == 0) && (*piVar4->gainstr != '\0')) {
LAB_0014ff8c:
        line = "You feel %s!";
LAB_0014ff93:
        pline(line);
      }
    }
    puVar6 = piVar4->ability;
    if ((uVar1 != *puVar6) &&
       (puVar6 == &u.uprops[0xc].intrinsic || puVar6 == &u.uprops[0x18].intrinsic)) {
      see_monsters();
    }
    piVar4 = piVar4 + 1;
    bVar10 = piVar9 != (innate *)0x0;
    bVar5 = true;
  } while( true );
}

Assistant:

void adjabil(int oldlevel, int newlevel)
{
	const struct innate *abil, *rabil;
	long mask = FROMEXPER;


	switch (Role_switch) {
	case PM_ARCHEOLOGIST:   abil = arc_abil;	break;
	case PM_BARBARIAN:      abil = bar_abil;	break;
	case PM_CAVEMAN:        abil = cav_abil;	break;
	case PM_CONVICT:        abil = con_abil;	break;
	case PM_HEALER:         abil = hea_abil;	break;
	case PM_KNIGHT:         abil = kni_abil;	break;
	case PM_MONK:           abil = mon_abil;	break;
	case PM_PRIEST:         abil = pri_abil;	break;
	case PM_RANGER:         abil = ran_abil;	break;
	case PM_ROGUE:          abil = rog_abil;	break;
	case PM_SAMURAI:        abil = sam_abil;	break;
	case PM_TOURIST:        abil = tou_abil;	break;
	case PM_VALKYRIE:       abil = val_abil;	break;
	case PM_WIZARD:         abil = wiz_abil;	break;
	default:                abil = 0;		break;
	}

	switch (Race_switch) {
	case PM_ELF:            rabil = elf_abil;	break;
	case PM_ORC:            rabil = orc_abil;	break;
	case PM_HUMAN:
	case PM_DWARF:
	case PM_GNOME:
	case PM_VAMPIRE:
	default:                rabil = 0;		break;
	}

	while (abil || rabil) {
	    long prevabil;
	    /* Have we finished with the intrinsics list? */
	    if (!abil || !abil->ability) {
	    	/* Try the race intrinsics */
	    	if (!rabil || !rabil->ability) break;
	    	abil = rabil;
	    	rabil = 0;
	    	mask = FROMRACE;
	    }
		prevabil = *(abil->ability);
		if (oldlevel < abil->ulevel && newlevel >= abil->ulevel) {
			/* Abilities gained at level 1 can never be lost
			 * via level loss, only via means that remove _any_
			 * sort of ability.  A "gain" of such an ability from
			 * an outside source is devoid of meaning, so we set
			 * FROMOUTSIDE to avoid such gains.
			 */
			if (abil->ulevel == 1)
				*(abil->ability) |= (mask|FROMOUTSIDE);
			else
				*(abil->ability) |= mask;
			if (!(*(abil->ability) & INTRINSIC & ~mask)) {
			    if (*(abil->gainstr))
				pline("You feel %s!", abil->gainstr);
			}
		} else if (oldlevel >= abil->ulevel && newlevel < abil->ulevel) {
			*(abil->ability) &= ~mask;
			if (!(*(abil->ability) & INTRINSIC)) {
			    if (*(abil->losestr))
				pline("You feel %s!", abil->losestr);
			    else if (*(abil->gainstr))
				pline("You feel less %s!", abil->gainstr);
			}
		}
	    if (prevabil != *(abil->ability))	/* it changed */
		postadjabil(abil->ability);
	    abil++;
	}

	if (oldlevel > 0) {
	    if (newlevel > oldlevel)
		add_weapon_skill(newlevel - oldlevel);
	    else
		lose_weapon_skill(oldlevel - newlevel);
	}
}